

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd.cc
# Opt level: O3

bool ReadFromFD(int fd,size_t *out_bytes_read,void *out,size_t num)

{
  size_t sVar1;
  int *piVar2;
  size_t sVar3;
  
  do {
    sVar1 = read(fd,out,num);
    if (sVar1 != 0xffffffffffffffff) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 0x16);
  sVar3 = 0;
  if (-1 < (long)sVar1) {
    sVar3 = sVar1;
  }
  *out_bytes_read = sVar3;
  return -1 < (long)sVar1;
}

Assistant:

bool ReadFromFD(int fd, size_t *out_bytes_read, void *out, size_t num) {
#if defined(OPENSSL_WINDOWS)
  // On Windows, the buffer must be at most |INT_MAX|. See
  // https://docs.microsoft.com/en-us/cpp/c-runtime-library/reference/read?view=vs-2019
  int ret = _read(fd, out, std::min(size_t{INT_MAX}, num));
#else
  ssize_t ret;
  do {
    ret = read(fd, out, num);
  } while (ret == -1 && errno == EINVAL);
#endif

  if (ret < 0) {
    *out_bytes_read = 0;
    return false;
  }
  *out_bytes_read = ret;
  return true;
}